

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_grouping.cpp
# Opt level: O0

bool __thiscall
icu_63::number::impl::Grouper::groupAtPosition
          (Grouper *this,int32_t position,DecimalQuantity *value)

{
  int iVar1;
  int32_t iVar2;
  bool local_31;
  DecimalQuantity *value_local;
  int32_t position_local;
  Grouper *this_local;
  
  if ((this->fGrouping1 == -1) || (this->fGrouping1 == 0)) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = position - this->fGrouping1;
    local_31 = false;
    if ((-1 < iVar1) && (local_31 = false, iVar1 % (int)this->fGrouping2 == 0)) {
      iVar2 = DecimalQuantity::getUpperDisplayMagnitude(value);
      local_31 = (int)this->fMinGrouping <= (iVar2 - this->fGrouping1) + 1;
    }
    this_local._7_1_ = local_31;
  }
  return this_local._7_1_;
}

Assistant:

bool Grouper::groupAtPosition(int32_t position, const impl::DecimalQuantity &value) const {
    U_ASSERT(fGrouping1 > -2);
    if (fGrouping1 == -1 || fGrouping1 == 0) {
        // Either -1 or 0 means "no grouping"
        return false;
    }
    position -= fGrouping1;
    return position >= 0 && (position % fGrouping2) == 0
           && value.getUpperDisplayMagnitude() - fGrouping1 + 1 >= fMinGrouping;
}